

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sad.c
# Opt level: O2

uint sad(uint8_t *a,int a_stride,uint8_t *b,int b_stride,int width,int height)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  
  uVar5 = 0;
  uVar4 = (ulong)(uint)width;
  if (width < 1) {
    uVar4 = uVar5;
  }
  if (height < 1) {
    height = 0;
  }
  uVar2 = 0;
  for (; (int)uVar5 != height; uVar5 = (ulong)((int)uVar5 + 1)) {
    for (uVar6 = 0; uVar4 != uVar6; uVar6 = uVar6 + 1) {
      uVar3 = (uint)a[uVar6] - (uint)b[uVar6];
      uVar1 = -uVar3;
      if (0 < (int)uVar3) {
        uVar1 = uVar3;
      }
      uVar2 = uVar2 + (uVar1 & 0xff);
    }
    a = a + a_stride;
    b = b + b_stride;
  }
  return uVar2;
}

Assistant:

static inline unsigned int sad(const uint8_t *a, int a_stride, const uint8_t *b,
                               int b_stride, int width, int height) {
  int y, x;
  unsigned int sad = 0;

  for (y = 0; y < height; y++) {
    for (x = 0; x < width; x++) {
      sad += abs(a[x] - b[x]);
    }

    a += a_stride;
    b += b_stride;
  }
  return sad;
}